

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

void __thiscall Am_Value_List_Data::Make_Empty(Am_Value_List_Data *this)

{
  Am_List_Item *pAVar1;
  Am_List_Item *this_00;
  
  this_00 = this->head;
  while (this_00 != (Am_List_Item *)0x0) {
    pAVar1 = this_00->next;
    this_00->prev = (Am_List_Item *)0x0;
    this_00->next = (Am_List_Item *)0x0;
    Am_Value::~Am_Value(&this_00->super_Am_Value);
    operator_delete(this_00);
    this_00 = pAVar1;
  }
  *(undefined2 *)&(this->super_Am_Wrapper).field_0xc = 0;
  this->head = (Am_List_Item *)0x0;
  this->tail = (Am_List_Item *)0x0;
  return;
}

Assistant:

void
Am_Value_List_Data::Make_Empty()
{
  Am_List_Item *next;
  for (Am_List_Item *curr = head; curr; curr = next) {
    next = curr->next;
    curr->next = nullptr;
    curr->prev = nullptr;
    delete curr;
  }
  head = nullptr;
  tail = nullptr;
  number = 0;
}